

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseBinding.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sparse::anon_unknown_2::BufferSparseBindingCase::createInstance
          (BufferSparseBindingCase *this,Context *context)

{
  deUint32 dVar1;
  TestInstance *pTVar2;
  
  pTVar2 = (TestInstance *)operator_new(0x80);
  dVar1 = this->m_bufferSize;
  pTVar2->m_context = context;
  *(undefined4 *)&pTVar2[1].m_context = 0;
  pTVar2[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[2].m_context = (Context *)&pTVar2[1].m_context;
  pTVar2[3]._vptr_TestInstance = (_func_int **)&pTVar2[1].m_context;
  pTVar2[3].m_context = (Context *)0x0;
  pTVar2[4]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[6]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[6].m_context = (Context *)0x0;
  pTVar2[5]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[5].m_context = (Context *)0x0;
  pTVar2->_vptr_TestInstance = (_func_int **)&PTR__SparseResourcesBaseInstance_00cffb18;
  *(deUint32 *)&pTVar2[7].m_context = dVar1;
  return pTVar2;
}

Assistant:

TestInstance* BufferSparseBindingCase::createInstance (Context& context) const
{
	return new BufferSparseBindingInstance(context, m_bufferSize);
}